

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatingDisplay.cpp
# Opt level: O3

void __thiscall FloatingDisplay::FloatingDisplay(FloatingDisplay *this,QWidget *mainWindow)

{
  QCursor *pQVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Master *pMVar7;
  QSettings *pQVar8;
  LCDWidget *this_00;
  MidiMessageLEDWidget *this_01;
  QSize *pQVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  undefined1 auVar18 [16];
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  
  pMVar7 = Master::getInstance();
  pQVar8 = Master::getSettings(pMVar7);
  QVar14.m_data = (storage_type *)0x23;
  QVar14.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar14);
  QVariant::QVariant((QVariant *)&local_58,true);
  QSettings::value((QString *)local_78.data,(QVariant *)pQVar8);
  uVar4 = QVariant::toBool();
  QVariant::~QVariant((QVariant *)&local_78);
  QVariant::~QVariant((QVariant *)&local_58);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,8);
    }
  }
  QFrame::QFrame(&this->super_QFrame,0,(uVar4 & 0xff) << 10 | 0x4080b);
  *(undefined ***)this = &PTR_metaObject_001c8560;
  *(undefined ***)&this->field_0x10 = &PTR__FloatingDisplay_001c8718;
  this->mainWindow = mainWindow;
  this->synthRoute = (SynthRoute *)0x0;
  this->lcdWidget = (LCDWidget *)0x0;
  this->midiMessageLED = (MidiMessageLEDWidget *)0x0;
  this->dragStatus = DRAG_STATUS_OFF;
  (this->dragOrigin).xp = 0;
  *(undefined8 *)&(this->dragOrigin).yp = 0;
  (this->startWindowPosition).yp = 0;
  QFrame::setFrameShape((Shadow)this);
  QFrame::setFrameShadow((Shadow)this);
  QVar15.m_data = (storage_type *)0xd;
  QVar15.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar15);
  local_58.shared = local_78.shared;
  local_58._8_8_ = local_78._8_8_;
  local_58._16_8_ = local_78._16_8_;
  QWidget::setWindowTitle((QString *)this);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,8);
    }
  }
  pMVar7 = Master::getInstance();
  pQVar8 = Master::getSettings(pMVar7);
  QVar16.m_data = (storage_type *)0x17;
  QVar16.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar16);
  uVar2 = local_58.shared;
  QVariant::QVariant((QVariant *)&local_58,100);
  QSettings::value((QString *)local_78.data,(QVariant *)pQVar8);
  iVar5 = QVariant::toInt((bool *)local_78.data);
  QVariant::~QVariant((QVariant *)&local_78);
  QVariant::~QVariant((QVariant *)&local_58);
  if ((QArrayData *)uVar2 != (QArrayData *)0x0) {
    LOCK();
    *(int *)uVar2 = *(int *)uVar2 + -1;
    UNLOCK();
    if (*(int *)uVar2 == 0) {
      QArrayData::deallocate((QArrayData *)uVar2,2,8);
    }
  }
  iVar6 = 100;
  if (iVar5 < 100) {
    iVar6 = iVar5;
  }
  iVar5 = 0x19;
  if (0x19 < iVar6) {
    iVar5 = iVar6;
  }
  QWidget::setWindowOpacity((double)iVar5 / 100.0);
  iVar5 = QFrame::frameWidth();
  this_00 = (LCDWidget *)operator_new(0x78);
  LCDWidget::LCDWidget(this_00,(QWidget *)this);
  this->lcdWidget = this_00;
  iVar6 = QFrame::frameWidth();
  local_78._4_4_ = iVar5 + 2;
  local_78._0_4_ = iVar6 + 2;
  QWidget::move((QPoint *)this_00);
  this_01 = (MidiMessageLEDWidget *)operator_new(0x30);
  MidiMessageLEDWidget::MidiMessageLEDWidget(this_01,(QWidget *)this);
  this->midiMessageLED = this_01;
  pQVar9 = (QSize *)operator_new(0x28);
  QWidget::QWidget((QWidget *)pQVar9,this,0);
  this->sizeGrip = (QWidget *)pQVar9;
  QWidget::resize(pQVar9);
  pQVar1 = (QCursor *)this->sizeGrip;
  QCursor::QCursor((QCursor *)local_78.data,SizeFDiagCursor);
  QWidget::setCursor(pQVar1);
  QCursor::~QCursor((QCursor *)local_78.data);
  iVar6 = (**(code **)(*(long *)this->lcdWidget + 0x70))();
  this->baseWindowWidth = iVar6 + (iVar5 + 2) * 2 + 0xe;
  QVar17.m_data = (storage_type *)0x18;
  QVar17.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar17);
  uVar2 = local_58.shared;
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_40 = 2;
  QSettings::value((QString *)local_78.data,(QVariant *)pQVar8);
  auVar18 = QVariant::toRect();
  uVar13 = auVar18._0_8_;
  uVar12 = uVar13 >> 0x20;
  QVariant::~QVariant((QVariant *)&local_78);
  QVariant::~QVariant((QVariant *)&local_58);
  if ((QArrayData *)uVar2 != (QArrayData *)0x0) {
    LOCK();
    *(int *)uVar2 = *(int *)uVar2 + -1;
    UNLOCK();
    if (*(int *)uVar2 == 0) {
      QArrayData::deallocate((QArrayData *)uVar2,2,8);
    }
  }
  if (auVar18._12_4_ < auVar18._4_4_ || auVar18._8_4_ < auVar18._0_4_) {
    layoutWidgets(this,this->baseWindowWidth);
    uVar2 = *(undefined8 *)(*(long *)&this->field_0x20 + 0x14);
    uVar3 = *(undefined8 *)(*(long *)&this->field_0x20 + 0x1c);
    lVar10 = *(long *)(mainWindow + 0x20);
    lVar11 = (long)*(int *)(lVar10 + 0x1c) + (long)*(int *)(lVar10 + 0x14);
    lVar10 = (long)*(int *)(lVar10 + 0x20) + (long)*(int *)(lVar10 + 0x18);
    uVar13 = (ulong)(uint)((int)((ulong)(lVar11 - (lVar11 >> 0x3f)) >> 1) -
                          ((int)uVar3 - (int)uVar2) / 2);
    uVar12 = (ulong)(uint)((int)((ulong)(lVar10 - (lVar10 >> 0x3f)) >> 1) -
                          ((int)((ulong)uVar3 >> 0x20) - (int)((ulong)uVar2 >> 0x20)) / 2);
  }
  else {
    layoutWidgets(this,(auVar18._8_4_ - auVar18._0_4_) + 1);
  }
  local_78.shared = (PrivateShared *)(uVar13 & 0xffffffff | uVar12 << 0x20);
  QWidget::move((QPoint *)this);
  adjustGeometryToScreen(this);
  return;
}

Assistant:

FloatingDisplay::FloatingDisplay(const QWidget *mainWindow) :
	QFrame(NULL, makeWindowFlags()),
	mainWindow(mainWindow), synthRoute(), lcdWidget(), midiMessageLED(), dragStatus()
{
	setFrameShape(QFrame::Box);
	setFrameShadow(QFrame::Raised);
	setWindowTitle("Munt: Display");

	QSettings *settings = Master::getInstance()->getSettings();
	int storedOpacity = settings->value("FloatingDisplay/opacity", 100).toInt();
	setWindowOpacity(qreal(qBound(MIN_OPACITY_VALUE, storedOpacity, 100) / 100.0));

	int frameWithMargin = frameWidth() + CONTENT_MARGIN;

	lcdWidget = new LCDWidget(this);
	lcdWidget->move(frameWidth() + CONTENT_MARGIN, frameWithMargin);

	midiMessageLED = new MidiMessageLEDWidget(this);

	sizeGrip = new QWidget(this);
	sizeGrip->resize(SIZE_GRIP_SIZE);
	sizeGrip->setCursor(Qt::SizeFDiagCursor);

	baseWindowWidth = lcdWidget->sizeHint().width() + MIDI_MESSAGE_LED_SIZE.width() + 2 * frameWithMargin + LAYOUT_SPACING;
	QRect rect = settings->value("FloatingDisplay/geometry").toRect();
	if (rect.isValid()) {
		layoutWidgets(rect.width());
		rect.setSize(size());
	} else {
		layoutWidgets(baseWindowWidth);
		rect = geometry();
		rect.moveCenter(mainWindow->geometry().center());
	}
	move(rect.topLeft());
	adjustGeometryToScreen();
}